

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

void MergeUVPlane(uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,uint8_t *dst_uv,
                 int dst_stride_uv,int width,int height)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int local_4c;
  
  iVar1 = height;
  if (height < 0) {
    iVar1 = -height;
    dst_uv = dst_uv + ~height * dst_stride_uv;
    dst_stride_uv = -dst_stride_uv;
  }
  local_4c = src_stride_v;
  if (width * 2 == dst_stride_uv && (src_stride_v == width && src_stride_u == width)) {
    width = iVar1 * src_stride_u;
    iVar1 = 1;
    src_stride_u = 0;
    local_4c = 0;
    dst_stride_uv = 0;
  }
  iVar2 = libyuv::TestCpuFlag(0x20);
  if ((width & 0xfU) == 0) {
    pcVar4 = MergeUVRow_SSE2;
  }
  else {
    pcVar4 = MergeUVRow_Any_SSE2;
  }
  if (iVar2 == 0) {
    pcVar4 = MergeUVRow_C;
  }
  iVar2 = libyuv::TestCpuFlag(0x400);
  if ((width & 0x1fU) == 0) {
    pcVar3 = MergeUVRow_AVX2;
  }
  else {
    pcVar3 = MergeUVRow_Any_AVX2;
  }
  if (iVar2 == 0) {
    pcVar3 = pcVar4;
  }
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    (*pcVar3)(src_u,src_v,dst_uv,width);
    src_u = src_u + src_stride_u;
    src_v = src_v + local_4c;
    dst_uv = dst_uv + dst_stride_uv;
  }
  return;
}

Assistant:

LIBYUV_API
void MergeUVPlane(const uint8_t* src_u,
                  int src_stride_u,
                  const uint8_t* src_v,
                  int src_stride_v,
                  uint8_t* dst_uv,
                  int dst_stride_uv,
                  int width,
                  int height) {
  int y;
  void (*MergeUVRow)(const uint8_t* src_u, const uint8_t* src_v,
                     uint8_t* dst_uv, int width) = MergeUVRow_C;
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_uv = dst_uv + (height - 1) * dst_stride_uv;
    dst_stride_uv = -dst_stride_uv;
  }
  // Coalesce rows.
  if (src_stride_u == width && src_stride_v == width &&
      dst_stride_uv == width * 2) {
    width *= height;
    height = 1;
    src_stride_u = src_stride_v = dst_stride_uv = 0;
  }
#if defined(HAS_MERGEUVROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    MergeUVRow = MergeUVRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      MergeUVRow = MergeUVRow_SSE2;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    MergeUVRow = MergeUVRow_Any_AVX2;
    if (IS_ALIGNED(width, 32)) {
      MergeUVRow = MergeUVRow_AVX2;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MergeUVRow = MergeUVRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      MergeUVRow = MergeUVRow_NEON;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    MergeUVRow = MergeUVRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      MergeUVRow = MergeUVRow_MMI;
    }
  }
#endif
#if defined(HAS_MERGEUVROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    MergeUVRow = MergeUVRow_Any_MSA;
    if (IS_ALIGNED(width, 16)) {
      MergeUVRow = MergeUVRow_MSA;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Merge a row of U and V into a row of UV.
    MergeUVRow(src_u, src_v, dst_uv, width);
    src_u += src_stride_u;
    src_v += src_stride_v;
    dst_uv += dst_stride_uv;
  }
}